

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

void amrex::DistributionMapping::strategy(Strategy how)

{
  m_Strategy = how;
  switch(how) {
  case ROUNDROBIN:
    m_BuildMap = RoundRobinProcessorMap;
    break;
  case KNAPSACK:
    m_BuildMap = KnapSackProcessorMap;
    break;
  case SFC:
    m_BuildMap = SFCProcessorMap;
    break;
  case RRSFC:
    m_BuildMap = RRSFCProcessorMap;
    break;
  default:
    Error_host("Bad DistributionMapping::Strategy");
    return;
  }
  _DAT_00842898 = 0;
  return;
}

Assistant:

void
DistributionMapping::strategy (DistributionMapping::Strategy how)
{
    DistributionMapping::m_Strategy = how;

    switch (how)
    {
    case ROUNDROBIN:
        m_BuildMap = &DistributionMapping::RoundRobinProcessorMap;
        break;
    case KNAPSACK:
        m_BuildMap = &DistributionMapping::KnapSackProcessorMap;
        break;
    case SFC:
        m_BuildMap = &DistributionMapping::SFCProcessorMap;
        break;
    case RRSFC:
        m_BuildMap = &DistributionMapping::RRSFCProcessorMap;
        break;
    default:
        amrex::Error("Bad DistributionMapping::Strategy");
    }
}